

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_read_statement(Parser *this)

{
  Type TVar1;
  Token *pTVar2;
  AbstractSyntaxNode *pAVar3;
  bool bVar4;
  Type local_40c;
  Token local_408;
  Type local_3ac;
  Token local_3a8;
  Type local_34c;
  Token local_348;
  int local_2ec [5];
  Token local_2d8;
  int local_280 [6];
  Token local_268;
  Type local_1fc;
  Token local_1f8;
  stringstream local_1a0 [8];
  stringstream buffer;
  int local_18 [2];
  Parser *local_10;
  Parser *this_local;
  
  pAVar3 = this->current_;
  local_18[1] = 0x30;
  local_18[0] = 1;
  local_10 = this;
  pTVar2 = forward_token(this,local_18);
  pAVar3 = AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_18 + 1),pTVar2);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1fc = kRead;
  match(&local_1f8,this,&local_1fc);
  Token::~Token(&local_1f8);
  local_280[5] = 0xb;
  match(&local_268,this,(Type *)(local_280 + 5));
  Token::~Token(&local_268);
  local_280[4] = 1;
  pTVar2 = forward_token(this,local_280 + 4);
  TVar1 = Token::type(pTVar2);
  bVar4 = false;
  if (TVar1 == kIdentity) {
    local_280[3] = 2;
    pTVar2 = forward_token(this,local_280 + 3);
    TVar1 = Token::type(pTVar2);
    bVar4 = TVar1 == kLeftBracket;
  }
  if (bVar4) {
    pAVar3 = this->current_;
    local_280[2] = 0x36;
    local_280[1] = 1;
    pTVar2 = forward_token(this,local_280 + 1);
    pAVar3 = AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_280 + 2),pTVar2);
    this->current_ = pAVar3;
    pAVar3 = this->current_;
    local_280[0] = 1;
    pTVar2 = forward_token(this,local_280);
    AbstractSyntaxNode::add_child(pAVar3,pTVar2);
    local_2ec[4] = 0x21;
    match(&local_2d8,this,(Type *)(local_2ec + 4));
    Token::~Token(&local_2d8);
    parse_array(this);
    pAVar3 = AbstractSyntaxNode::parent(this->current_);
    this->current_ = pAVar3;
  }
  else {
    local_2ec[3] = 1;
    pTVar2 = forward_token(this,local_2ec + 3);
    TVar1 = Token::type(pTVar2);
    if (TVar1 == kIdentity) {
      pAVar3 = this->current_;
      local_2ec[2] = 0x21;
      local_2ec[1] = 1;
      pTVar2 = forward_token(this,local_2ec + 1);
      pAVar3 = AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_2ec + 2),pTVar2);
      this->current_ = pAVar3;
      pAVar3 = this->current_;
      local_2ec[0] = 1;
      pTVar2 = forward_token(this,local_2ec);
      AbstractSyntaxNode::add_child(pAVar3,pTVar2);
      local_34c = kIdentity;
      match(&local_348,this,&local_34c);
      Token::~Token(&local_348);
      pAVar3 = AbstractSyntaxNode::parent(this->current_);
      this->current_ = pAVar3;
    }
  }
  local_3ac = kRightParen;
  match(&local_3a8,this,&local_3ac);
  Token::~Token(&local_3a8);
  local_40c = kSemicolon;
  match(&local_408,this,&local_40c);
  Token::~Token(&local_408);
  pAVar3 = AbstractSyntaxNode::parent(this->current_);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void Parser::parse_read_statement() {
    current_ = current_->add_child(Token::Type::kReadStatement, forward_token());
    std::stringstream buffer;

    match(Token::Type::kRead);
    match(Token::Type::kLeftParen);
    if (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() == Token::Type::kLeftBracket) {
        current_ = current_->add_child(Token::Type::kIdentityArray, forward_token());
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
        parse_array();
        current_ = current_->parent();
    } else if (forward_token().type() == Token::Type::kIdentity) {
        current_ = current_->add_child(Token::Type::kIdentity, forward_token());
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
        current_ = current_->parent();
    }
    match(Token::Type::kRightParen);
    match(Token::Type::kSemicolon);

    current_ = current_->parent();
}